

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverCreateTautology(Mvc_Cover_t *pCover)

{
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar1;
  Mvc_List_t *pList;
  int _i_;
  Mvc_Cover_t *pCoverNew;
  Mvc_Cube_t *pCubeNew;
  Mvc_Cover_t *pCover_local;
  
  pCover_00 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  pMVar1 = Mvc_CubeAlloc(pCover_00);
  if ((*(uint *)&pMVar1->field_0x8 & 0xffffff) == 0) {
    pMVar1->pData[0] =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar1->field_0x8 >> 0x18) & 0x1f);
  }
  else if ((*(uint *)&pMVar1->field_0x8 & 0xffffff) == 1) {
    pMVar1->pData[0] = 0xffffffff;
    *(uint *)&pMVar1->field_0x14 =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar1->field_0x8 >> 0x18) & 0x1f);
  }
  else {
    pMVar1->pData[*(uint *)&pMVar1->field_0x8 & 0xffffff] =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar1->field_0x8 >> 0x18) & 0x1f);
    pList._4_4_ = *(uint *)&pMVar1->field_0x8 & 0xffffff;
    while (pList._4_4_ = pList._4_4_ - 1, -1 < (int)pList._4_4_) {
      pMVar1->pData[(int)pList._4_4_] = 0xffffffff;
    }
  }
  if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    (pCover_00->lCubes).pHead = pMVar1;
  }
  else {
    ((pCover_00->lCubes).pTail)->pNext = pMVar1;
  }
  (pCover_00->lCubes).pTail = pMVar1;
  pMVar1->pNext = (Mvc_Cube_t *)0x0;
  (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverCreateTautology( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCubeNew;
    Mvc_Cover_t * pCoverNew;
    pCoverNew = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pCubeNew = Mvc_CubeAlloc( pCoverNew );
    Mvc_CubeBitFill( pCubeNew );
    Mvc_CoverAddCubeTail( pCoverNew, pCubeNew );
    return pCoverNew;
}